

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Tjen::Node::Node(Node *this,Node *n)

{
  string *psVar1;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__x;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_78;
  Node *local_18;
  Node *n_local;
  Node *this_local;
  
  local_18 = n;
  n_local = this;
  std::__cxx11::string::string((string *)this);
  std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::vector
            (&this->transitions);
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,std::deque<char,std::allocator<char>>> *)&this->stack);
  getStack(&local_78,local_18);
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::operator=(&this->stack,&local_78);
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_78);
  psVar1 = getName_abi_cxx11_(local_18);
  std::__cxx11::string::operator=((string *)this,(string *)psVar1);
  __x = getTransitions(local_18);
  std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::operator=
            (&this->transitions,__x);
  return;
}

Assistant:

Tjen::Node::Node(Node *n) {
    stack = n->getStack();
    name = n->getName();
    transitions = n->getTransitions();
}